

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

int spec_dbon(obj *otmp,obj *olaunch,boolean thrown,monst *mon,int tmp)

{
  uchar uVar1;
  obj *poVar2;
  boolean bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  artifact *paVar7;
  obj **ppoVar8;
  int iVar9;
  artifact *weap;
  
  if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
    weap = (artifact *)0x0;
  }
  else {
    weap = artilist + otmp->oartifact;
  }
  paVar7 = (artifact *)0x0;
  spec_dbon_applies = 0;
  spec_applies_ad_fire = '\0';
  spec_applies_ad_cold = '\0';
  spec_applies_ad_elec = '\0';
  spec_applies_ad_magm = '\0';
  spec_applies_ad_stun = '\0';
  spec_applies_ad_drli = '\0';
  if (otmp != (obj *)0x0) {
    if ((long)otmp->oartifact == 0) {
      paVar7 = (artifact *)0x0;
    }
    else {
      paVar7 = artilist + otmp->oartifact;
    }
  }
  if (paVar7 == (artifact *)0x0) {
    spec_applies_spfx_behead = 0;
  }
  else {
    spec_applies_spfx_behead = (byte)((uint)paVar7->spfx >> 10) & 1;
  }
  if (weap == (artifact *)0x0) {
    if (mon == &youmonst) {
      ppoVar8 = &uwep;
    }
    else {
      ppoVar8 = &mon->mw;
    }
    poVar2 = *ppoVar8;
    bVar3 = attacks(2,otmp,olaunch,thrown);
    iVar9 = 0;
    if (bVar3 != '\0') {
      if (mon == &youmonst) {
        if ((u.uprops[1].intrinsic != 0 || u.uprops[1].extrinsic != 0) ||
           (((byte)youmonst.mintrinsics & 1) != 0)) {
          if (((u.uprops[1].intrinsic >> 0x1a & 1) == 0) ||
             (bVar4 = (byte)youmonst.mintrinsics,
             (u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0))
          goto LAB_0014ceb0;
          goto joined_r0x0014ce2f;
        }
      }
      else {
        bVar4 = (byte)mon->mintrinsics;
joined_r0x0014ce2f:
        if ((bVar4 & 1) != 0) goto LAB_0014ceb0;
      }
      if (((poVar2 == (obj *)0x0) || ((long)poVar2->oartifact == 0)) ||
         (artilist[poVar2->oartifact].defn.adtyp != '\x02')) {
        spec_dbon_applies = 1;
        spec_applies_ad_fire = '\x01';
        uVar5 = 6;
        if (((mon == &youmonst) && ((u.uprops[1].intrinsic >> 0x1a & 1) != 0)) &&
           ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) {
          uVar5 = ((byte)youmonst.mintrinsics & 1) * 3 + 3;
        }
        uVar6 = mt_random();
        iVar9 = uVar6 % uVar5 + 1;
      }
    }
LAB_0014ceb0:
    bVar3 = attacks(3,otmp,olaunch,thrown);
    if (bVar3 != '\0') {
      if (mon == &youmonst) {
        if ((u.uprops[2].intrinsic != 0 || u.uprops[2].extrinsic != 0) ||
           (((byte)youmonst.mintrinsics & 2) != 0)) {
          if (((u.uprops[2].intrinsic >> 0x1a & 1) == 0) ||
             (bVar4 = (byte)youmonst.mintrinsics,
             (u.uprops[2].intrinsic & 0xfbffffff) != 0 || u.uprops[2].extrinsic != 0))
          goto LAB_0014cfb6;
          goto joined_r0x0014cf22;
        }
      }
      else {
        bVar4 = (byte)mon->mintrinsics;
joined_r0x0014cf22:
        if ((bVar4 & 2) != 0) goto LAB_0014cfb6;
      }
      if (((poVar2 == (obj *)0x0) || ((long)poVar2->oartifact == 0)) ||
         (artilist[poVar2->oartifact].defn.adtyp != '\x03')) {
        spec_dbon_applies = 1;
        spec_applies_ad_cold = '\x01';
        uVar5 = 6;
        if (((mon == &youmonst) && ((u.uprops[2].intrinsic >> 0x1a & 1) != 0)) &&
           ((u.uprops[2].intrinsic & 0xfbffffff) == 0 && u.uprops[2].extrinsic == 0)) {
          bVar4 = ((byte)youmonst.mintrinsics & 2) >> 1;
          uVar5 = (uint)bVar4 + (uint)bVar4 * 2 + 3;
        }
        uVar6 = mt_random();
        iVar9 = iVar9 + uVar6 % uVar5 + 1;
      }
    }
LAB_0014cfb6:
    bVar3 = attacks(0xf,otmp,olaunch,thrown);
    if (bVar3 != '\0') {
      if (mon == &youmonst) {
        if (u.uprops[0x35].extrinsic != 0 || u.uprops[0x35].intrinsic != 0) goto LAB_0014d034;
        mon = &youmonst;
      }
      bVar3 = resists_drli(mon);
      if ((bVar3 == '\0') &&
         (((poVar2 == (obj *)0x0 || ((long)poVar2->oartifact == 0)) ||
          (artilist[poVar2->oartifact].defn.adtyp != '\x0f')))) {
        spec_dbon_applies = 1;
        spec_applies_ad_drli = '\x01';
      }
    }
LAB_0014d034:
    bVar3 = oprop_attack(8,otmp,olaunch,thrown);
    if (bVar3 == '\0') {
      return iVar9;
    }
    spec_dbon_applies = 1;
    spec_applies_spfx_behead = '\x01';
    return iVar9;
  }
  if ((((weap->attk).adtyp == '\0') && ((weap->attk).damn == '\0')) && ((weap->attk).damd == '\0'))
  {
    spec_dbon_applies = 0;
  }
  else {
    spec_dbon_applies = spec_applies(weap,mon);
  }
  if (spec_dbon_applies == 0) {
    return 0;
  }
  bVar4 = (weap->attk).damd;
  if (bVar4 == 0) {
    uVar5 = 1;
    if (1 < tmp) {
      uVar5 = tmp;
    }
  }
  else {
    uVar5 = mt_random();
    uVar5 = uVar5 % (uint)bVar4 + 1;
  }
  if (mon != &youmonst) {
    return uVar5;
  }
  if ((weap->spfx & 0x40) == 0) {
    return uVar5;
  }
  uVar1 = (weap->attk).adtyp;
  switch(uVar1) {
  case '\x02':
    if ((((u.uprops[1].intrinsic >> 0x1a & 1) != 0) &&
        ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) &&
       (((byte)youmonst.mintrinsics & 1) == 0)) goto LAB_0014cde3;
    if (uVar1 != '\a') {
      if (uVar1 != '\x06') {
        if (uVar1 != '\x03') {
          return uVar5;
        }
        goto switchD_0014ccfb_caseD_3;
      }
      goto switchD_0014ccfb_caseD_6;
    }
    break;
  case '\x03':
switchD_0014ccfb_caseD_3:
    if ((((u.uprops[2].intrinsic >> 0x1a & 1) != 0) &&
        ((u.uprops[2].intrinsic & 0xfbffffff) == 0 && u.uprops[2].extrinsic == 0)) &&
       (((byte)youmonst.mintrinsics & 2) == 0)) goto LAB_0014cde3;
    if (uVar1 != '\a') {
      if (uVar1 != '\x06') {
        return uVar5;
      }
      goto switchD_0014ccfb_caseD_6;
    }
    break;
  default:
    goto switchD_0014ccfb_caseD_4;
  case '\x06':
switchD_0014ccfb_caseD_6:
    if ((((u.uprops[5].intrinsic >> 0x1a & 1) == 0) ||
        ((u.uprops[5].intrinsic & 0xfbffffff) != 0 || u.uprops[5].extrinsic != 0)) ||
       (((byte)youmonst.mintrinsics & 0x10) != 0)) {
      if (uVar1 != '\a') {
        return uVar5;
      }
      break;
    }
    goto LAB_0014cde3;
  case '\a':
    break;
  }
  if ((((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
      ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)) &&
     (((byte)youmonst.mintrinsics & 0x20) == 0)) {
LAB_0014cde3:
    uVar5 = uVar5 + 1 >> 1;
  }
switchD_0014ccfb_caseD_4:
  return uVar5;
}

Assistant:

int spec_dbon(struct obj *otmp, struct obj *olaunch, boolean thrown,
	      struct monst *mon, int tmp)
{
	const struct artifact *weap = get_artifact(otmp);
	boolean yours = (mon == &youmonst);

	spec_dbon_applies = FALSE;

	spec_applies_ad_fire = FALSE;
	spec_applies_ad_cold = FALSE;
	spec_applies_ad_elec = FALSE;
	spec_applies_ad_magm = FALSE;
	spec_applies_ad_stun = FALSE;
	spec_applies_ad_drli = FALSE;
	spec_applies_spfx_behead = spec_ability(otmp, SPFX_BEHEAD);

	if (!weap) {
	    /* Object must have properties, which might stack. */
	    int propdmg = 0;
	    struct obj *defwep = (yours ? uwep : MON_WEP(mon));

	    if ((attacks(AD_FIRE, otmp, olaunch, thrown) &&
		!(yours ? FFire_resistance : resists_fire(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_FIRE, defwep)))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_fire = TRUE;
		propdmg += rnd((yours && PFire_resistance) ? 3 : 6);
	    }

	    if ((attacks(AD_COLD, otmp, olaunch, thrown) &&
		!(yours ? FCold_resistance : resists_cold(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_COLD, defwep)))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_cold = TRUE;
		propdmg += rnd((yours && PCold_resistance) ? 3 : 6);
	    }

	    /* No AD_MAGM/spec_applies_ad_magm (magic missile) property effect. */

	    /* No AD_STUN/spec_applies_ad_stun (stun) property effect. */

	    /* Life-draining is handled specially in artifact_hit(). */
	    if (attacks(AD_DRLI, otmp, olaunch, thrown) &&
		!(yours ? Drain_resistance : resists_drli(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_DRLI, defwep))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_drli = TRUE;
	    }

	    /* [SPFX_BEHEAD] This *may* apply; only artifact_hit_behead()
	     * truly decides that. */
	    if (oprop_attack(ITEM_VORPAL, otmp, olaunch, thrown)) {
		spec_dbon_applies = TRUE;
		spec_applies_spfx_behead = TRUE;
	    }

	    return propdmg;
	}

	if (!weap || (weap->attk.adtyp == AD_PHYS && /* check for `NO_ATTK' */
			weap->attk.damn == 0 && weap->attk.damd == 0))
	    spec_dbon_applies = FALSE;
	else
	    spec_dbon_applies = spec_applies(weap, mon);

	if (spec_dbon_applies) {
	    int dmg_bonus = weap->attk.damd ? rnd(weap->attk.damd) : max(tmp, 1);
	    /* halve artifact bonus damage for partial resistances */
	    if (yours && (weap->spfx & SPFX_ATTK)) {
		uchar adtyp = weap->attk.adtyp;
		if ((adtyp == AD_FIRE && PFire_resistance) ||
		    (adtyp == AD_COLD && PCold_resistance) ||
		    (adtyp == AD_ELEC && PShock_resistance) ||
		    (adtyp == AD_DRST && PPoison_resistance)) {
		    dmg_bonus = (dmg_bonus + 1) / 2;
		}
	    }
	    return dmg_bonus;
	}
	return 0;
}